

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O1

void __thiscall
boost::deflate::inflate_stream_test::Boost::operator()
          (Boost *this,int window,string *in,string *check)

{
  ulong j;
  size_t i;
  ulong i_00;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  anon_class_32_4_6ef9e63a f;
  int local_54;
  anon_class_32_4_6ef9e63a local_50;
  
  local_50.window = &local_54;
  uVar1 = in->_M_string_length;
  if (this->in_ == full) {
    i_00 = 1;
  }
  else {
    i_00 = uVar1;
    if (this->in_ == half) {
      i_00 = uVar1 >> 1;
      uVar1 = i_00;
    }
  }
  uVar3 = check->_M_string_length;
  if (this->check_ == full) {
    uVar2 = 1;
  }
  else {
    uVar2 = uVar3;
    if (this->check_ == half) {
      uVar2 = uVar3 >> 1;
      uVar3 = uVar2;
    }
  }
  if (i_00 <= uVar1) {
    j = uVar2;
    local_54 = window;
    local_50.check = check;
    local_50.in = in;
    local_50.this = this;
    do {
      for (; j <= uVar3; j = j + 1) {
        operator()::anon_class_32_4_6ef9e63a::operator()(&local_50,i_00,j);
      }
      i_00 = i_00 + 1;
      j = uVar2;
    } while (i_00 <= uVar1);
  }
  return;
}

Assistant:

void operator()(
            int window,
            std::string const& in,
            std::string const& check) const
        {
            auto const f =
            [&](std::size_t i, std::size_t j)
            {
                std::string out(check.size(), 0);
                z_params zs;
                zs.next_in = in.data();
                zs.next_out = &out[0];
                zs.avail_in = i;
                zs.avail_out = j;
                inflate_stream is;
                is.reset(window);
                bool bi = i >= in.size();
                bool bo = j >= check.size();
                for(;;)
                {
                    error_code ec;
                    is.write(zs, flush_, ec);
                    if( ec == error::need_buffers ||
                        ec == error::end_of_stream)
                    {
                        out.resize(zs.total_out);
                        BOOST_TEST(out == check);
                        break;
                    }
                    if(ec)
                    {
                        BOOST_ERROR(ec.message().c_str());
                        break;
                    }
                    if(zs.avail_in == 0 && ! bi)
                    {
                        bi = true;
                        zs.avail_in = in.size() - i;
                    }
                    if(zs.avail_out == 0 && ! bo)
                    {
                        bo = true;
                        zs.avail_out = check.size() - j;
                    }
                }
            };

            std::size_t i0, i1;
            std::size_t j0, j1;

            switch(in_)
            {
            default:
            case once: i0 = in.size();     i1 = i0;         break;
            case half: i0 = in.size() / 2; i1 = i0;         break;
            case full: i0 = 1;             i1 = in.size();  break;
            }

            switch(check_)
            {
            default:
            case once: j0 = check.size();     j1 = j0;              break;
            case half: j0 = check.size() / 2; j1 = j0;              break;
            case full: j0 = 1;                j1 = check.size();    break;
            }

            for(std::size_t i = i0; i <= i1; ++i)
                for(std::size_t j = j0; j <= j1; ++j)
                    f(i, j);
        }